

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.hpp
# Opt level: O0

int __thiscall Variant::toInt(Variant *this)

{
  Variant *this_local;
  
  switch(this->data->type) {
  case boolType:
    this_local._4_4_ = (uint)(((this->data->data).boolData & 1U) != 0);
    break;
  case doubleType:
    this_local._4_4_ = (uint)(this->data->data).doubleData;
    break;
  case intType:
    this_local._4_4_ = (this->data->data).intData;
    break;
  case uintType:
    this_local._4_4_ = (this->data->data).intData;
    break;
  case int64Type:
    this_local._4_4_ = (this->data->data).intData;
    break;
  case uint64Type:
    this_local._4_4_ = (this->data->data).intData;
    break;
  default:
    this_local._4_4_ = 0;
    break;
  case stringType:
    this_local._4_4_ = String::toInt((String *)(this->data + 1));
  }
  return this_local._4_4_;
}

Assistant:

int toInt() const
  {
    switch(data->type)
    {
    case boolType: return data->data.boolData ? 1 : 0;
    case doubleType: return (int)data->data.doubleData;
    case intType: return data->data.intData;
    case uintType: return (int)data->data.uintData;
    case int64Type: return (int)data->data.int64Data;
    case uint64Type: return (int)data->data.uint64Data;
    case stringType: return ((const String*)(data + 1))->toInt();
    default:
      return 0;
    }
  }